

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_reclaim(asmcode *code,compiler_options *ops)

{
  skiwi *this;
  uint64_t in_RDX;
  compiler_options *pcVar1;
  string reclaim;
  undefined1 local_38 [48];
  
  this = label;
  pcVar1 = (compiler_options *)local_38;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)(local_38 + 0x10),this,in_RDX);
  local_38._0_4_ = CMP;
  local_38[4] = true;
  local_38[5] = false;
  local_38[6] = false;
  local_38[7] = false;
  local_38[0xc] = true;
  local_38[0xd] = false;
  local_38[0xe] = false;
  local_38[0xf] = false;
  local_38[8] = true;
  local_38[9] = false;
  local_38[10] = false;
  local_38[0xb] = false;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)local_38,(operand *)(local_38 + 4),(operand *)(local_38 + 0xc),
             (int *)(local_38 + 8));
  local_38._0_4_ = JGS;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_38 + 0x10))
  ;
  local_38._0_4_ = JMP;
  local_38[4] = true;
  local_38[5] = false;
  local_38[6] = false;
  local_38[7] = false;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)local_38,(operand *)(local_38 + 4));
  local_38._0_4_ = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_38 + 0x10))
  ;
  compile_reclaim_garbage(code,pcVar1);
  std::__cxx11::string::~string((string *)(local_38 + 0x10));
  return;
}

Assistant:

void compile_reclaim(asmcode& code, const compiler_options& ops)
  {
  auto reclaim = label_to_string(label++);
  code.add(asmcode::CMP, ALLOC, LIMIT);
  code.add(asmcode::JGS, reclaim);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, reclaim);
  compile_reclaim_garbage(code, ops);
  }